

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.hpp
# Opt level: O0

pair<const_pstore::index::details::index_pointer,_unsigned_long> __thiscall
pstore::index::details::linear_node::
lookup<pstore::indirect_string,pstore::indirect_string,std::equal_to<pstore::indirect_string>,void>
          (linear_node *this,indirect_string *db,size_t key)

{
  bool bVar1;
  const_iterator paVar2;
  database_reader *archive;
  index_pointer local_a8;
  value_type local_a0;
  index_pointer local_98;
  value_type local_90;
  database_reader local_88;
  undefined1 local_78 [8];
  indirect_string existing_key;
  address *child;
  const_iterator __end3;
  const_iterator __begin3;
  linear_node *__range3;
  size_t cnum;
  indirect_string *key_local;
  database *db_local;
  linear_node *this_local;
  pair<const_pstore::index::details::index_pointer,_unsigned_long> local_18;
  
  __range3 = (linear_node *)0x0;
  cnum = key;
  key_local = db;
  db_local = (database *)this;
  __end3 = begin(this);
  paVar2 = end(this);
  while( true ) {
    if (__end3 == paVar2) {
      index_pointer::index_pointer((index_pointer *)&local_a8.addr_);
      std::pair<const_pstore::index::details::index_pointer,_unsigned_long>::
      pair<pstore::index::details::index_pointer,_true>(&local_18,&local_a8,&not_found);
      return local_18;
    }
    existing_key.field_2.str_ = (raw_sstring_view *)__end3;
    local_90 = __end3->a_;
    serialize::archive::database_reader::database_reader
              (&local_88,(database *)key_local,(address)local_90);
    serialize::read<pstore::indirect_string,pstore::serialize::archive::database_reader>
              ((indirect_string *)local_78,(serialize *)&local_88,archive);
    bVar1 = std::equal_to<pstore::indirect_string>::operator()
                      ((equal_to<pstore::indirect_string> *)((long)&this_local + 7),
                       (indirect_string *)local_78,(indirect_string *)cnum);
    if (bVar1) break;
    __range3 = (linear_node *)((__range3->signature_)._M_elems + 1);
    __end3 = __end3 + 1;
  }
  local_a0 = (value_type)(existing_key.field_2.str_)->ptr_;
  index_pointer::index_pointer((index_pointer *)&local_98.addr_,(address)local_a0);
  std::pair<const_pstore::index::details::index_pointer,_unsigned_long>::
  pair<pstore::index::details::index_pointer,_unsigned_long_&,_true>
            (&local_18,&local_98,(unsigned_long *)&__range3);
  return local_18;
}

Assistant:

auto linear_node::lookup (database const & db, OtherKeyType const & key,
                                      KeyEqual equal) const
                -> std::pair<index_pointer const, std::size_t> {
                // Linear search. TODO: perhaps we should sort the nodes and use a binary
                // search? This would require a template compare method.
                std::size_t cnum = 0;
                for (auto const & child : *this) {
                    KeyType const existing_key =
                        serialize::read<KeyType> (serialize::archive::database_reader{db, child});
                    if (equal (existing_key, key)) {
                        return {index_pointer{child}, cnum};
                    }
                    ++cnum;
                }
                // Not found
                return {index_pointer (), details::not_found};
            }